

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int dotlockUnlock(sqlite3_file *id,int eFileLock)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  
  iVar1 = 0;
  iVar3 = 0;
  if ((uint)*(byte *)((long)&id[3].pMethods + 4) != eFileLock) {
    iVar3 = iVar1;
    if (eFileLock == 1) {
      *(undefined1 *)((long)&id[3].pMethods + 4) = 1;
    }
    else {
      iVar1 = (*aSyscall[0x13].pCurrent)(id[5].pMethods);
      if (iVar1 < 0) {
        piVar2 = __errno_location();
        if (*piVar2 != 2) {
          *(int *)&id[4].pMethods = *piVar2;
          iVar3 = 0x80a;
        }
      }
      else {
        *(undefined1 *)((long)&id[3].pMethods + 4) = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

static int dotlockUnlock(sqlite3_file *id, int eFileLock) {
  unixFile *pFile = (unixFile*)id;
  char *zLockFile = (char *)pFile->lockingContext;
  int rc;

  assert( pFile );
  OSTRACE(("UNLOCK  %d %d was %d pid=%d (dotlock)\n", pFile->h, eFileLock,
           pFile->eFileLock, osGetpid(0)));
  assert( eFileLock<=SHARED_LOCK );

  /* no-op if possible */
  if( pFile->eFileLock==eFileLock ){
    return SQLITE_OK;
  }

  /* To downgrade to shared, simply update our internal notion of the
  ** lock state.  No need to mess with the file on disk.
  */
  if( eFileLock==SHARED_LOCK ){
    pFile->eFileLock = SHARED_LOCK;
    return SQLITE_OK;
  }

  /* To fully unlock the database, delete the lock file */
  assert( eFileLock==NO_LOCK );
  rc = osRmdir(zLockFile);
  if( rc<0 ){
    int tErrno = errno;
    if( tErrno==ENOENT ){
      rc = SQLITE_OK;
    }else{
      rc = SQLITE_IOERR_UNLOCK;
      storeLastErrno(pFile, tErrno);
    }
    return rc;
  }
  pFile->eFileLock = NO_LOCK;
  return SQLITE_OK;
}